

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RadixSort.cpp
# Opt level: O0

void srs::radixSort(vector<Graph::Edge,_std::allocator<Graph::Edge>_> *A)

{
  value_type_conflict1 vVar1;
  undefined7 uVar2;
  pointer this;
  bool bVar3;
  size_type sVar4;
  reference pvVar5;
  reference pEVar6;
  reference pvVar7;
  reference pvVar8;
  u64 uVar9;
  size_type local_878;
  u64 i_2;
  u64 i_1;
  Edge *i;
  iterator __end2;
  iterator __begin2;
  vector<Graph::Edge,_std::allocator<Graph::Edge>_> *__range2;
  array<unsigned_long,_256UL> B;
  u64 deg;
  allocator<Graph::Edge> local_29;
  undefined1 local_28 [8];
  vector<Graph::Edge,_std::allocator<Graph::Edge>_> R;
  vector<Graph::Edge,_std::allocator<Graph::Edge>_> *A_local;
  
  R.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)A;
  sVar4 = std::vector<Graph::Edge,_std::allocator<Graph::Edge>_>::size(A);
  pvVar5 = std::vector<Graph::Edge,_std::allocator<Graph::Edge>_>::operator[]
                     ((vector<Graph::Edge,_std::allocator<Graph::Edge>_> *)
                      R.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,0);
  std::allocator<Graph::Edge>::allocator(&local_29);
  std::vector<Graph::Edge,_std::allocator<Graph::Edge>_>::vector
            ((vector<Graph::Edge,_std::allocator<Graph::Edge>_> *)local_28,sVar4,pvVar5,&local_29);
  std::allocator<Graph::Edge>::~allocator(&local_29);
  for (B._M_elems[0xff] = 0; B._M_elems[0xff] < 8; B._M_elems[0xff] = B._M_elems[0xff] + 1) {
    memset(&__range2,0,0x800);
    this = R.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
    __end2 = std::vector<Graph::Edge,_std::allocator<Graph::Edge>_>::begin
                       ((vector<Graph::Edge,_std::allocator<Graph::Edge>_> *)
                        R.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    i = (Edge *)std::vector<Graph::Edge,_std::allocator<Graph::Edge>_>::end
                          ((vector<Graph::Edge,_std::allocator<Graph::Edge>_> *)this);
    while( true ) {
      bVar3 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<Graph::Edge_*,_std::vector<Graph::Edge,_std::allocator<Graph::Edge>_>_>
                                  *)&i);
      if (!bVar3) break;
      pEVar6 = __gnu_cxx::
               __normal_iterator<Graph::Edge_*,_std::vector<Graph::Edge,_std::allocator<Graph::Edge>_>_>
               ::operator*(&__end2);
      uVar9 = ind(pEVar6->shift,B._M_elems[0xff]);
      pvVar7 = std::array<unsigned_long,_256UL>::operator[]
                         ((array<unsigned_long,_256UL> *)&__range2,uVar9);
      *pvVar7 = *pvVar7 + 1;
      __gnu_cxx::
      __normal_iterator<Graph::Edge_*,_std::vector<Graph::Edge,_std::allocator<Graph::Edge>_>_>::
      operator++(&__end2);
    }
    i_2 = 1;
    while( true ) {
      sVar4 = std::array<unsigned_long,_256UL>::size((array<unsigned_long,_256UL> *)&__range2);
      if (sVar4 <= i_2) break;
      pvVar7 = std::array<unsigned_long,_256UL>::operator[]
                         ((array<unsigned_long,_256UL> *)&__range2,i_2 - 1);
      vVar1 = *pvVar7;
      pvVar7 = std::array<unsigned_long,_256UL>::operator[]
                         ((array<unsigned_long,_256UL> *)&__range2,i_2);
      *pvVar7 = vVar1 + *pvVar7;
      i_2 = i_2 + 1;
    }
    local_878 = std::vector<Graph::Edge,_std::allocator<Graph::Edge>_>::size
                          ((vector<Graph::Edge,_std::allocator<Graph::Edge>_> *)
                           R.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
    while (sVar4 = local_878 - 1, local_878 != 0) {
      pvVar5 = std::vector<Graph::Edge,_std::allocator<Graph::Edge>_>::operator[]
                         ((vector<Graph::Edge,_std::allocator<Graph::Edge>_> *)
                          R.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,sVar4);
      pvVar8 = std::vector<Graph::Edge,_std::allocator<Graph::Edge>_>::operator[]
                         ((vector<Graph::Edge,_std::allocator<Graph::Edge>_> *)
                          R.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,sVar4);
      uVar9 = ind(pvVar8->shift,B._M_elems[0xff]);
      pvVar7 = std::array<unsigned_long,_256UL>::operator[]
                         ((array<unsigned_long,_256UL> *)&__range2,uVar9);
      vVar1 = *pvVar7;
      *pvVar7 = vVar1 - 1;
      pvVar8 = std::vector<Graph::Edge,_std::allocator<Graph::Edge>_>::operator[]
                         ((vector<Graph::Edge,_std::allocator<Graph::Edge>_> *)local_28,vVar1 - 1);
      (pvVar8->super_LightEdge).u = (pvVar5->super_LightEdge).u;
      (pvVar8->super_LightEdge).v = (pvVar5->super_LightEdge).v;
      uVar2 = *(undefined7 *)&pvVar5->field_0x11;
      pvVar8->finished = pvVar5->finished;
      *(undefined7 *)&pvVar8->field_0x11 = uVar2;
      pvVar8->shift = pvVar5->shift;
      local_878 = sVar4;
    }
    std::swap<Graph::Edge,std::allocator<Graph::Edge>>
              ((vector<Graph::Edge,_std::allocator<Graph::Edge>_> *)
               R.super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage,
               (vector<Graph::Edge,_std::allocator<Graph::Edge>_> *)local_28);
  }
  std::vector<Graph::Edge,_std::allocator<Graph::Edge>_>::~vector
            ((vector<Graph::Edge,_std::allocator<Graph::Edge>_> *)local_28);
  return;
}

Assistant:

void srs::radixSort(std::vector<Graph::Edge> &A) {
    std::vector<Graph::Edge> R(A.size(), A[0]);
    for (u64 deg = 0; deg < Digits; ++deg) {
        std::array<u64, Variants> B{};

        for (auto &i : A)
            ++B[ind(i.shift, deg)];

        for (u64 i = 1; i < B.size(); ++i)
            B[i] += B[i - 1];

        for (u64 i = A.size(); i--;)
            R[--B[ind(A[i].shift, deg)]] = A[i];
        std::swap(A, R);
    }
}